

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.cpp
# Opt level: O1

void __thiscall HighsHessian::print(HighsHessian *this)

{
  ulong uVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  vector<double,_std::allocator<double>_> col;
  vector<double,_std::allocator<double>_> local_58;
  value_type_conflict1 local_38;
  
  printf("Hessian of dimension %d and %d entries\n",(long)this->dim_,
         (ulong)(uint)(this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[this->dim_]);
  printf("Start; Index; Value of sizes %d; %d; %d\n",
         (ulong)((long)(this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start) >> 2,
         (ulong)((long)(this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start) >> 2,
         (ulong)((long)(this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start) >> 3);
  if (0 < this->dim_) {
    printf(" Row|");
    if (0 < this->dim_) {
      uVar8 = 0;
      do {
        printf(" %4d",uVar8);
        uVar6 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar6;
      } while ((int)uVar6 < this->dim_);
    }
    putchar(10);
    printf("-----");
    if (0 < this->dim_) {
      iVar7 = 0;
      do {
        printf("-----");
        iVar7 = iVar7 + 1;
      } while (iVar7 < this->dim_);
    }
    putchar(10);
    local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&local_58,(long)this->dim_,&local_38);
    if (0 < this->dim_) {
      uVar8 = 0;
      do {
        piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar7 = piVar3[uVar8];
        lVar5 = (long)iVar7;
        iVar2 = piVar3[uVar8 + 1];
        if (iVar7 < iVar2) {
          piVar3 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar4 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[piVar3[lVar5]] = pdVar4[lVar5];
            lVar5 = lVar5 + 1;
          } while (iVar2 != lVar5);
        }
        printf("%4d|",uVar8 & 0xffffffff);
        if (0 < this->dim_) {
          lVar5 = 0;
          do {
            printf(" %4g",SUB84(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start[lVar5],0));
            lVar5 = lVar5 + 1;
          } while (lVar5 < this->dim_);
        }
        uVar1 = uVar8 + 1;
        putchar(10);
        piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar7 = piVar3[uVar8];
        lVar5 = (long)iVar7;
        iVar2 = piVar3[uVar1];
        if (iVar7 < iVar2) {
          piVar3 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[piVar3[lVar5]] = 0.0;
            lVar5 = lVar5 + 1;
          } while (iVar2 != lVar5);
        }
        uVar8 = uVar1;
      } while ((long)uVar1 < (long)this->dim_);
    }
    if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void HighsHessian::print() const {
  HighsInt num_nz = this->numNz();
  printf("Hessian of dimension %" HIGHSINT_FORMAT " and %" HIGHSINT_FORMAT
         " entries\n",
         dim_, num_nz);
  printf("Start; Index; Value of sizes %d; %d; %d\n", (int)this->start_.size(),
         (int)this->index_.size(), (int)this->value_.size());
  if (dim_ <= 0) return;
  printf(" Row|");
  for (int iCol = 0; iCol < dim_; iCol++) printf(" %4d", iCol);
  printf("\n");
  printf("-----");
  for (int iCol = 0; iCol < dim_; iCol++) printf("-----");
  printf("\n");
  std::vector<double> col;
  col.assign(dim_, 0);
  for (HighsInt iCol = 0; iCol < dim_; iCol++) {
    for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1]; iEl++)
      col[this->index_[iEl]] = this->value_[iEl];
    printf("%4d|", (int)iCol);
    for (int iRow = 0; iRow < dim_; iRow++) printf(" %4g", col[iRow]);
    printf("\n");
    for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1]; iEl++)
      col[this->index_[iEl]] = 0;
  }
}